

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O1

int __thiscall CaDiCaL::Internal::negative_horn_satisfiable(Internal *this)

{
  anon_struct_8_2_4505284c_for_terminate *paVar1;
  int64_t *piVar2;
  int iVar3;
  pointer ppCVar4;
  Terminator *pTVar5;
  Clause *pCVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  Clause *__range2;
  int in_EDX;
  int iVar10;
  long lVar11;
  int iVar12;
  pointer ppCVar13;
  bool bVar14;
  bool bVar15;
  
  ppCVar13 = (this->clauses).
             super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar4 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar14 = ppCVar13 == ppCVar4;
  if (!bVar14) {
    do {
      if (this->termination_forced == false) {
        iVar10 = (this->lim).terminate.forced;
        if ((iVar10 != 0) && ((this->lim).terminate.forced = iVar10 + -1, iVar10 == 1)) {
LAB_0083da4a:
          this->termination_forced = true;
          goto LAB_0083da51;
        }
        pTVar5 = this->external->terminator;
        if (pTVar5 != (Terminator *)0x0) {
          paVar1 = &(this->lim).terminate;
          iVar10 = paVar1->check;
          paVar1->check = paVar1->check + -1;
          if (iVar10 == 0) {
            (this->lim).terminate.check = (this->opts).terminateint * 10;
            cVar8 = (**(code **)(*(long *)pTVar5 + 0x10))();
            if (cVar8 != '\0') goto LAB_0083da4a;
          }
        }
        pCVar6 = *ppCVar13;
        bVar7 = true;
        if ((*(ushort *)&pCVar6->field_0x8 & 0x810) == 0) {
          if ((long)pCVar6->size == 0) {
            bVar9 = false;
            iVar10 = 0;
          }
          else {
            iVar10 = 0;
            bVar9 = false;
            lVar11 = 0;
            do {
              iVar12 = *(int *)((long)&pCVar6[1].field_0 + lVar11);
              bVar15 = true;
              if (this->vals[iVar12] < '\x01') {
                if (this->vals[iVar12] < '\0') {
                  bVar15 = false;
                }
                else {
                  bVar15 = iVar12 < 1;
                  if (iVar12 < 1) {
                    iVar10 = iVar12;
                  }
                }
              }
              else {
                bVar9 = true;
              }
            } while ((!bVar15) &&
                    (bVar15 = (long)pCVar6->size * 4 + -4 != lVar11, lVar11 = lVar11 + 4, bVar15));
          }
          if (bVar9) goto LAB_0083da7a;
          if (iVar10 == 0) {
            if (0 < this->level) {
              backtrack(this,0);
            }
          }
          else {
            search_assume_decision(this,iVar10);
            bVar9 = propagate(this);
            if (bVar9) goto LAB_0083da7a;
          }
          if (0 < this->level) {
            backtrack(this,0);
          }
          in_EDX = 0;
          goto LAB_0083da69;
        }
      }
      else {
LAB_0083da51:
        if (0 < this->level) {
          backtrack(this,0);
        }
        in_EDX = -1;
LAB_0083da69:
        if (this->conflict != (Clause *)0x0) {
          this->conflict = (Clause *)0x0;
        }
        bVar7 = false;
      }
LAB_0083da7a:
      if (!bVar7) break;
      ppCVar13 = ppCVar13 + 1;
      bVar14 = ppCVar13 == ppCVar4;
    } while (!bVar14);
  }
  if (bVar14) {
    iVar10 = *(this->vars).n;
    bVar14 = iVar10 == 0;
    if (!bVar14) {
      iVar12 = 1;
      do {
        if (this->termination_forced == false) {
          iVar3 = (this->lim).terminate.forced;
          if ((iVar3 != 0) && ((this->lim).terminate.forced = iVar3 + -1, iVar3 == 1)) {
LAB_0083dbf7:
            this->termination_forced = true;
            goto LAB_0083dbfe;
          }
          pTVar5 = this->external->terminator;
          if (pTVar5 != (Terminator *)0x0) {
            paVar1 = &(this->lim).terminate;
            iVar3 = paVar1->check;
            paVar1->check = paVar1->check + -1;
            if (iVar3 == 0) {
              (this->lim).terminate.check = (this->opts).terminateint * 10;
              cVar8 = (**(code **)(*(long *)pTVar5 + 0x10))();
              if (cVar8 != '\0') goto LAB_0083dbf7;
            }
          }
          bVar7 = true;
          if (this->vals[iVar12] == '\0') {
            search_assume_decision(this,iVar12);
            bVar9 = propagate(this);
            if (bVar9) goto LAB_0083dc27;
            if (0 < this->level) {
              backtrack(this,0);
            }
            in_EDX = 0;
            goto LAB_0083dc16;
          }
        }
        else {
LAB_0083dbfe:
          if (0 < this->level) {
            backtrack(this,0);
          }
          in_EDX = -1;
LAB_0083dc16:
          if (this->conflict != (Clause *)0x0) {
            this->conflict = (Clause *)0x0;
          }
          bVar7 = false;
        }
LAB_0083dc27:
        if (!bVar7) break;
        bVar14 = iVar12 == iVar10;
        iVar12 = iVar12 + 1;
      } while (!bVar14);
    }
    if (bVar14) {
      if (this->internal != (Internal *)0x0) {
        verbose(this->internal,1,"clauses are negative horn satisfied");
      }
      piVar2 = &(this->stats).lucky.horn.negative;
      *piVar2 = *piVar2 + 1;
      in_EDX = 10;
    }
  }
  return in_EDX;
}

Assistant:

int Internal::negative_horn_satisfiable () {
  LOG ("checking that all clauses are negative horn satisfiable");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    int negative_literal = 0;
    bool satisfied = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit > 0)
        continue;
      negative_literal = lit;
      break;
    }
    if (satisfied)
      continue;
    if (!negative_literal) {
      if (level > 0)
        backtrack ();
      LOG (c, "no negative unassigned literal in");
      return unlucky (0);
    }
    assert (negative_literal < 0);
    LOG (c, "found negative literal %d in", negative_literal);
    search_assume_decision (negative_literal);
    if (propagate ())
      continue;
    LOG ("propagation of negative literal %d leads to conflict",
         negative_literal);
    return unlucky (0);
  }
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    LOG ("propagation of remaining literal %d leads to conflict", idx);
    return unlucky (0);
  }
  VERBOSE (1, "clauses are negative horn satisfied");
  assert (!conflict);
  assert (satisfied ());
  stats.lucky.horn.negative++;
  return 10;
}